

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::Name_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string name;
  bool is_union_type;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  if ((Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len),
     iVar1 != 0)) {
    pcVar2 = UnionTypeFieldSuffix();
    Name::union_suffix_len = strlen(pcVar2);
    __cxa_guard_release(&Name[abi:cxx11](flatbuffers::FieldDef_const&)::union_suffix_len);
  }
  name.field_2._M_local_buf[0xb] = (field->value).type.base_type == BASE_TYPE_UTYPE;
  if ((this->opts_).super_IDLOptions.cpp_object_api_field_case_style == CaseStyle_Unchanged) {
    EscapeKeyword(__return_storage_ptr__,this,(string *)field);
  }
  else {
    std::__cxx11::string::string((string *)local_50,(string *)field);
    if ((name.field_2._M_local_buf[0xb] & 1U) != 0) {
      uVar3 = std::__cxx11::string::length();
      if (uVar3 <= Name::union_suffix_len) {
        __assert_fail("name.length() > union_suffix_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                      ,0x155,
                      "std::string flatbuffers::cpp::CppGenerator::Name(const FieldDef &) const");
      }
      lVar4 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)local_50,lVar4 - Name::union_suffix_len);
    }
    if ((this->opts_).super_IDLOptions.cpp_object_api_field_case_style == CaseStyle_Upper) {
      ConvertCase(&local_70,(string *)local_50,kUpperCamel,kSnake);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else if ((this->opts_).super_IDLOptions.cpp_object_api_field_case_style == CaseStyle_Lower) {
      ConvertCase(&local_90,(string *)local_50,kLowerCamel,kSnake);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((name.field_2._M_local_buf[0xb] & 1U) != 0) {
      pcVar2 = UnionTypeFieldSuffix();
      std::__cxx11::string::append(local_50,(ulong)pcVar2);
    }
    EscapeKeyword(__return_storage_ptr__,this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Name(const FieldDef &field) const {
    // the union type field suffix is immutable.
    static size_t union_suffix_len = strlen(UnionTypeFieldSuffix());
    const bool is_union_type = field.value.type.base_type == BASE_TYPE_UTYPE;
    // early return if no case transformation required
    if (opts_.cpp_object_api_field_case_style ==
        IDLOptions::CaseStyle_Unchanged)
      return EscapeKeyword(field.name);
    std::string name = field.name;
    // do not change the case style of the union type field suffix
    if (is_union_type) {
      FLATBUFFERS_ASSERT(name.length() > union_suffix_len);
      name.erase(name.length() - union_suffix_len, union_suffix_len);
    }
    if (opts_.cpp_object_api_field_case_style == IDLOptions::CaseStyle_Upper)
      name = ConvertCase(name, Case::kUpperCamel);
    else if (opts_.cpp_object_api_field_case_style ==
             IDLOptions::CaseStyle_Lower)
      name = ConvertCase(name, Case::kLowerCamel);
    // restore the union field type suffix
    if (is_union_type) name.append(UnionTypeFieldSuffix(), union_suffix_len);
    return EscapeKeyword(name);
  }